

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cc
# Opt level: O0

Optional<Rect> * __thiscall
SDL2pp::Renderer::GetClipRect(Optional<Rect> *__return_storage_ptr__,Renderer *this)

{
  bool bVar1;
  Rect local_44;
  undefined1 local_30 [8];
  SDL_Rect rect;
  Renderer *this_local;
  
  rect._8_8_ = this;
  SDL_RenderGetClipRect(this->renderer_,local_30);
  bVar1 = true;
  if ((&stack0x00000000 != (undefined1 *)0x30) && (bVar1 = true, 0 < rect.x)) {
    bVar1 = rect.y < 1;
  }
  if (bVar1) {
    sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::optional(__return_storage_ptr__);
  }
  else {
    Rect::Rect(&local_44,(SDL_Rect *)local_30);
    sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::optional(__return_storage_ptr__,&local_44);
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<Rect> Renderer::GetClipRect() const {
	SDL_Rect rect;
	SDL_RenderGetClipRect(renderer_, &rect);

	if (SDL_RectEmpty(&rect))
		return NullOpt;
	else
		return Rect(rect);
}